

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvlat1.cpp
# Opt level: O3

void ucnv_ASCIIFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                       UErrorCode *pErrorCode)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char *pcVar8;
  bool bVar9;
  char *pcVar10;
  char *pcVar11;
  UErrorCode UVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (pToUArgs->converter->toULength < '\x01') {
    pcVar10 = pToUArgs->source;
    pcVar8 = pToUArgs->sourceLimit;
    pcVar11 = pFromUArgs->target;
    uVar15 = *(int *)&pFromUArgs->targetLimit - (int)pcVar11;
    uVar13 = (int)pcVar8 - (int)pcVar10;
    if ((int)uVar15 <= (int)uVar13) {
      uVar13 = uVar15;
    }
    if (0xf < (int)uVar13) {
      uVar15 = uVar13 >> 4;
      do {
        cVar1 = *pcVar10;
        *pcVar11 = cVar1;
        cVar2 = pcVar10[1];
        pcVar11[1] = cVar2;
        cVar3 = pcVar10[2];
        pcVar11[2] = cVar3;
        cVar4 = pcVar10[3];
        pcVar11[3] = cVar4;
        cVar5 = pcVar10[4];
        pcVar11[4] = cVar5;
        cVar6 = pcVar10[5];
        pcVar11[5] = cVar6;
        auVar16[1] = cVar2;
        auVar16[0] = cVar1;
        cVar1 = pcVar10[6];
        pcVar11[6] = cVar1;
        auVar16[3] = cVar4;
        auVar16[2] = cVar3;
        cVar2 = pcVar10[7];
        pcVar11[7] = cVar2;
        cVar3 = pcVar10[8];
        pcVar11[8] = cVar3;
        auVar16[5] = cVar6;
        auVar16[4] = cVar5;
        cVar4 = pcVar10[9];
        pcVar11[9] = cVar4;
        auVar16[7] = cVar2;
        auVar16[6] = cVar1;
        cVar1 = pcVar10[10];
        pcVar11[10] = cVar1;
        cVar2 = pcVar10[0xb];
        pcVar11[0xb] = cVar2;
        cVar5 = pcVar10[0xc];
        pcVar11[0xc] = cVar5;
        cVar6 = pcVar10[0xd];
        pcVar11[0xd] = cVar6;
        cVar7 = pcVar10[0xe];
        pcVar11[0xe] = cVar7;
        auVar18._0_4_ = CONCAT22(CONCAT11(cVar2,cVar1),CONCAT11(cVar4,cVar3));
        cVar1 = pcVar10[0xf];
        pcVar11[0xf] = cVar1;
        uVar20 = CONCAT22(CONCAT11(cVar1,cVar7),CONCAT11(cVar6,cVar5));
        auVar16._12_4_ = uVar20;
        auVar16._8_4_ = auVar18._0_4_;
        auVar18._4_4_ = uVar20;
        auVar18._8_4_ = auVar18._0_4_;
        auVar18._12_4_ = uVar20;
        uVar20 = SUB164(auVar18 | auVar16,4);
        auVar17._4_4_ = uVar20;
        auVar17._0_4_ = uVar20;
        auVar17._8_4_ = uVar20;
        auVar17._12_4_ = uVar20;
        auVar17 = auVar17 | auVar18 | auVar16;
        auVar19._0_4_ = auVar17._0_4_ >> 0x10;
        auVar19._4_4_ = 0;
        auVar19._8_4_ = auVar17._8_4_ >> 0x10;
        auVar19._12_4_ = auVar17._12_4_ >> 0x10;
        if ((char)(SUB161(auVar19 | auVar17,1) | SUB161(auVar19 | auVar17,0)) < '\0')
        goto LAB_002c75b0;
        pcVar11 = pcVar11 + 0x10;
        pcVar10 = pcVar10 + 0x10;
        bVar9 = 1 < (int)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar9);
      uVar15 = 0;
LAB_002c75b0:
      uVar13 = (uVar15 - (uVar13 >> 4)) * 0x10 + uVar13;
    }
    if (0 < (int)uVar13) {
      iVar14 = uVar13 + 1;
      do {
        cVar1 = *pcVar10;
        if (cVar1 < '\0') {
          UVar12 = U_USING_DEFAULT_WARNING;
          goto LAB_002c75f8;
        }
        pcVar10 = pcVar10 + 1;
        *pcVar11 = cVar1;
        pcVar11 = pcVar11 + 1;
        iVar14 = iVar14 + -1;
      } while (1 < iVar14);
    }
    if ((pcVar10 < pcVar8) && (UVar12 = U_BUFFER_OVERFLOW_ERROR, pFromUArgs->targetLimit <= pcVar11)
       ) {
LAB_002c75f8:
      *pErrorCode = UVar12;
    }
    pToUArgs->source = pcVar10;
    pFromUArgs->target = pcVar11;
  }
  else {
    *pErrorCode = U_USING_DEFAULT_WARNING;
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_ASCIIFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                   UConverterToUnicodeArgs *pToUArgs,
                   UErrorCode *pErrorCode) {
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity, length;

    uint8_t c;

    if(pToUArgs->converter->toULength > 0) {
        /* no handling of partial UTF-8 characters here, fall back to pivoting */
        *pErrorCode=U_USING_DEFAULT_WARNING;
        return;
    }

    /* set up the local pointers */
    source=(const uint8_t *)pToUArgs->source;
    sourceLimit=(const uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    /*
     * since the conversion here is 1:1 uint8_t:uint8_t, we need only one counter
     * for the minimum of the sourceLength and targetCapacity
     */
    length=(int32_t)(sourceLimit-source);
    if(length<targetCapacity) {
        targetCapacity=length;
    }

    /* unroll the loop with the most common case */
    if(targetCapacity>=16) {
        int32_t count, loops;
        uint8_t oredChars;

        loops=count=targetCapacity>>4;
        do {
            oredChars=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;
            oredChars|=*target++=*source++;

            /* were all 16 entries really valid? */
            if(oredChars>0x7f) {
                /* no, return to the first of these 16 */
                source-=16;
                target-=16;
                break;
            }
        } while(--count>0);
        count=loops-count;
        targetCapacity-=16*count;
    }

    /* conversion loop */
    c=0;
    while(targetCapacity>0 && (c=*source)<=0x7f) {
        ++source;
        *target++=c;
        --targetCapacity;
    }

    if(c>0x7f) {
        /* non-ASCII character, handle in standard converter */
        *pErrorCode=U_USING_DEFAULT_WARNING;
    } else if(source<sourceLimit && target>=(const uint8_t *)pFromUArgs->targetLimit) {
        /* target is full */
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }

    /* write back the updated pointers */
    pToUArgs->source=(const char *)source;
    pFromUArgs->target=(char *)target;
}